

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition-parse.c
# Opt level: O2

int cd_match_data_init(parser_info *info,char **attr)

{
  char cVar1;
  coda_detection_rule *detection_rule;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  char *pcVar7;
  size_t sVar8;
  char *pcVar9;
  coda_expression *pcVar10;
  coda_expression *op2;
  coda_detection_rule_entry *pcVar11;
  undefined8 uVar12;
  char *pcVar13;
  node_info *pnVar14;
  char *pcVar15;
  char *__dest;
  bool bVar16;
  char *local_40;
  
  pnVar14 = info->node;
  pnVar14->free_data = coda_detection_rule_entry_delete;
  pcVar6 = get_attribute_value(attr,"offset");
  pcVar7 = get_attribute_value(attr,"path");
  if (pcVar7 != (char *)0x0) {
    if (pcVar6 != (char *)0x0) {
      coda_set_error(-400,"providing both \'path\' and \'offset\' attributes is not allowed");
      return -1;
    }
    detection_rule = (coda_detection_rule *)pnVar14->parent->data;
    pcVar6 = strdup(pcVar7);
    if (pcVar6 == (char *)0x0) {
      uVar12 = 0x8ca;
    }
    else {
      sVar8 = strlen(pcVar7);
      pcVar7 = (char *)malloc(sVar8 + 6);
      if (pcVar7 != (char *)0x0) {
        *pcVar7 = '\0';
        cVar1 = *pcVar6;
        pcVar13 = pcVar6;
        pcVar15 = pcVar7;
        if (cVar1 == '/') {
          *pcVar7 = '/';
          pcVar15 = pcVar7 + 1;
          pcVar13 = pcVar6 + 1;
          cVar1 = pcVar6[1];
        }
        if (cVar1 == '@') {
          *pcVar15 = '@';
          pcVar15 = pcVar15 + 1;
          pcVar13 = pcVar13 + 1;
        }
        bVar16 = true;
        bVar4 = false;
        bVar3 = cVar1 == '@';
LAB_0012e00d:
        bVar2 = bVar3;
        if (bVar16) {
          __dest = pcVar15;
          if (bVar4) {
            cVar1 = '/';
            if (bVar2) {
              cVar1 = '@';
            }
            *pcVar15 = cVar1;
            __dest = pcVar15 + 1;
          }
          if (*pcVar13 == '{') {
            local_40 = pcVar13 + 1;
            for (pcVar13 = pcVar13 + 2; pcVar13[-1] != '}'; pcVar13 = pcVar13 + 1) {
              if (pcVar13[-1] == '\0') {
                pcVar13 = detection_rule->product_definition->name;
                pcVar15 = "xml detection rule for \'%s\' has invalid path value";
                goto LAB_0012e264;
              }
            }
            pcVar13[-1] = '\0';
            pcVar15 = pcVar13;
          }
          else {
            local_40 = (char *)0x0;
            pcVar15 = pcVar13;
          }
          for (; ((cVar1 = *pcVar13, cVar1 != '\0' && (cVar1 != '/')) && (cVar1 != '@'));
              pcVar13 = pcVar13 + 1) {
          }
          bVar16 = cVar1 != '\0';
          *pcVar13 = '\0';
          pcVar9 = coda_identifier_from_name(pcVar15,(hashtable *)0x0);
          if (pcVar9 == (char *)0x0) {
            free(pcVar7);
            goto LAB_0012e279;
          }
          strcpy(__dest,pcVar9);
          sVar8 = strlen(pcVar9);
          pcVar15 = __dest + sVar8;
          free(pcVar9);
          if (local_40 == (char *)0x0) goto LAB_0012e1d0;
          pcVar10 = coda_expression_new(expr_goto_here,(char *)0x0,(coda_expression *)0x0,
                                        (coda_expression *)0x0,(coda_expression *)0x0,
                                        (coda_expression *)0x0);
          if ((pcVar10 != (coda_expression *)0x0) &&
             (pcVar10 = coda_expression_new(expr_string,(char *)0x0,pcVar10,(coda_expression *)0x0,
                                            (coda_expression *)0x0,(coda_expression *)0x0),
             pcVar10 != (coda_expression *)0x0)) {
            pcVar9 = strdup(local_40);
            if (pcVar9 == (char *)0x0) {
              coda_set_error(-1,"out of memory (could not duplicate string) (%s:%u)",
                             "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-definition-parse.c"
                             ,0x93c);
              coda_expression_delete(pcVar10);
              free(pcVar7);
              free(pcVar6);
              return -1;
            }
            op2 = coda_expression_new(expr_constant_string,pcVar9,(coda_expression *)0x0,
                                      (coda_expression *)0x0,(coda_expression *)0x0,
                                      (coda_expression *)0x0);
            if (op2 == (coda_expression *)0x0) {
              coda_expression_delete(pcVar10);
            }
            else {
              pcVar10 = coda_expression_new(expr_equal,(char *)0x0,pcVar10,op2,
                                            (coda_expression *)0x0,(coda_expression *)0x0);
              if (pcVar10 != (coda_expression *)0x0) {
                builtin_strncpy(__dest + sVar8,"@xmlns",7);
                pcVar11 = coda_detection_rule_entry_new(pcVar7);
                *pcVar15 = '\0';
                if (pcVar11 != (coda_detection_rule_entry *)0x0) {
                  iVar5 = coda_detection_rule_entry_set_expression(pcVar11,pcVar10);
                  if (iVar5 == 0) {
                    iVar5 = coda_detection_rule_add_entry(detection_rule,pcVar11);
                    if (iVar5 == 0) goto LAB_0012e1d0;
                    coda_detection_rule_entry_delete(pcVar11);
                    goto LAB_0012e271;
                  }
                  coda_detection_rule_entry_delete(pcVar11);
                }
                coda_expression_delete(pcVar10);
              }
            }
          }
          goto LAB_0012e271;
        }
        free(pcVar6);
        pcVar11 = coda_detection_rule_entry_new(pcVar7);
        pnVar14 = info->node;
        pnVar14->data = pcVar11;
        free(pcVar7);
        if (pnVar14->data == (void *)0x0) {
          return -1;
        }
        goto LAB_0012e29f;
      }
      uVar12 = 0x8d6;
    }
LAB_0012e247:
    coda_set_error(-1,"out of memory (could not duplicate string) (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-definition-parse.c"
                   ,uVar12);
    return -1;
  }
  pcVar11 = coda_detection_rule_entry_new((char *)0x0);
  pnVar14 = info->node;
  pnVar14->data = pcVar11;
  if (pcVar11 == (coda_detection_rule_entry *)0x0) {
    return -1;
  }
  if (pcVar6 != (char *)0x0) {
    pcVar7 = strdup(pcVar6);
    if (pcVar7 == (char *)0x0) {
      uVar12 = 0x9a0;
      goto LAB_0012e247;
    }
    pcVar10 = coda_expression_new(expr_constant_integer,pcVar7,(coda_expression *)0x0,
                                  (coda_expression *)0x0,(coda_expression *)0x0,
                                  (coda_expression *)0x0);
    if (pcVar10 == (coda_expression *)0x0) {
      coda_set_error(-400,"invalid \'offset\' attribute value \'%s\'",pcVar6);
      return -1;
    }
    iVar5 = coda_detection_rule_entry_set_expression
                      ((coda_detection_rule_entry *)info->node->data,pcVar10);
    if (iVar5 != 0) {
      coda_expression_delete(pcVar10);
      return -1;
    }
    pnVar14 = info->node;
  }
LAB_0012e29f:
  pnVar14->expect_char_data = 1;
  pnVar14->finalise_element = cd_match_data_finalise;
  return 0;
LAB_0012e1d0:
  bVar4 = true;
  bVar3 = cVar1 == '@';
  if (cVar1 != '\0') {
    if (bVar2) {
      pcVar13 = detection_rule->product_definition->name;
      pcVar15 = 
      "xml detection rule for \'%s\' has invalid path (attribute should be last item in path)";
LAB_0012e264:
      coda_set_error(-100,pcVar15,pcVar13);
LAB_0012e271:
      free(pcVar7);
LAB_0012e279:
      free(pcVar6);
      return -1;
    }
    pcVar13 = pcVar13 + 1;
  }
  goto LAB_0012e00d;
}

Assistant:

static int cd_match_data_init(parser_info *info, const char **attr)
{
    const char *offset_string;
    const char *path;
    coda_expression *expr;
    char *string_value;

    info->node->free_data = (free_data_handler)coda_detection_rule_entry_delete;

    offset_string = get_attribute_value(attr, "offset");
    path = get_attribute_value(attr, "path");

    if (path == NULL)
    {
        info->node->data = coda_detection_rule_entry_new(NULL);
        if (info->node->data == NULL)
        {
            return -1;
        }
    }
    if (offset_string != NULL)
    {
        if (path != NULL)
        {
            coda_set_error(CODA_ERROR_DATA_DEFINITION, "providing both 'path' and 'offset' attributes is not allowed");
            return -1;
        }
        string_value = strdup(offset_string);
        if (string_value == NULL)
        {
            coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not duplicate string) (%s:%u)", __FILE__,
                           __LINE__);
            return -1;
        }
        expr = coda_expression_new(expr_constant_integer, string_value, NULL, NULL, NULL, NULL);
        if (expr == NULL)
        {
            coda_set_error(CODA_ERROR_DATA_DEFINITION, "invalid 'offset' attribute value '%s'", offset_string);
            return -1;
        }
        if (coda_detection_rule_entry_set_expression((coda_detection_rule_entry *)info->node->data, expr) != 0)
        {
            coda_expression_delete(expr);
            return -1;
        }
    }
    else if (path != NULL)
    {
        if (add_detection_rule_entry_for_path((coda_detection_rule *)info->node->parent->data, path, &string_value) !=
            0)
        {
            return -1;
        }
        info->node->data = coda_detection_rule_entry_new(string_value);
        free(string_value);
        if (info->node->data == NULL)
        {
            return -1;
        }
    }

    info->node->expect_char_data = 1;
    info->node->finalise_element = cd_match_data_finalise;

    return 0;
}